

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O3

size_t __thiscall linq::IEnumerable<int_&>::Count(IEnumerable<int_&> *this)

{
  size_t sVar1;
  IEnumerableCore<linq::IEnumerable<int_&>_> local_28;
  
  local_28.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157638;
  local_28.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->state).super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->state).super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi;
  if (local_28.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.source.state.
            super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.source.state.
            super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
    }
  }
  sVar1 = IEnumerableCore<linq::IEnumerable<int_&>_>::Count(&local_28);
  local_28.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157638;
  if (local_28.source.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.source.state.
               super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  return sVar1;
}

Assistant:

decltype(auto) Current() const { return source.Current(); }